

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

void __thiscall
GlobOpt::OptHoistUpdateValueType
          (GlobOpt *this,Loop *loop,Instr *instr,Opnd **srcOpndPtr,Value *opndVal)

{
  Opnd *this_00;
  BasicBlock *block;
  code *pcVar1;
  bool bVar2;
  ValueNumber VVar3;
  ValueNumber VVar4;
  Sym *sym;
  undefined4 *puVar5;
  ValueInfo *pVVar6;
  anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0 *paVar7;
  Opnd *pOVar8;
  RegOpnd *this_01;
  Instr *pIVar9;
  PropertySym *pPVar10;
  Value *pVVar11;
  SymOpnd *this_02;
  anon_union_2_4_ea848c7b_for_ValueType_13 *paVar12;
  ValueInfo *opndObjPtrSymValueInfoInLandingPad;
  Value *opndObjPtrSymValInLandingPad;
  StackSym *opndObjPtrSym;
  Instr *convPrimStrInstr;
  RegOpnd *strOpnd;
  Value *pVStack_50;
  ValueType opndValueTypeInLandingPad;
  Value *opndValueInLandingPad;
  BasicBlock *landingPad;
  Sym *opndSym;
  Opnd *srcOpnd;
  Value *opndVal_local;
  Opnd **srcOpndPtr_local;
  Instr *instr_local;
  Loop *loop_local;
  GlobOpt *this_local;
  
  if ((((opndVal != (Value *)0x0) && (instr->m_opcode != FromVar)) && (srcOpndPtr != (Opnd **)0x0))
     && (*srcOpndPtr != (Opnd *)0x0)) {
    this_00 = *srcOpndPtr;
    sym = IR::Opnd::GetSym(this_00);
    if (sym != (Sym *)0x0) {
      block = loop->landingPad;
      pVStack_50 = GlobOptBlockData::FindValue(&block->globOptData,sym);
      VVar3 = ::Value::GetValueNumber(opndVal);
      VVar4 = ::Value::GetValueNumber(pVStack_50);
      if (VVar3 != VVar4) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,14999,
                           "(opndVal->GetValueNumber() == opndValueInLandingPad->GetValueNumber())",
                           "opndVal->GetValueNumber() == opndValueInLandingPad->GetValueNumber()");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      pVVar6 = ::Value::GetValueInfo(pVStack_50);
      paVar7 = (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0 *)
               ValueInfo::Type(pVVar6);
      strOpnd._6_2_ = *paVar7;
      strOpnd._4_2_ =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           IR::Opnd::GetValueType(this_00);
      strOpnd._2_2_ = strOpnd._6_2_;
      bVar2 = ValueType::operator!=((ValueType *)((long)&strOpnd + 4),(ValueType)strOpnd._6_2_);
      if (bVar2) {
        strOpnd._0_2_ = strOpnd._6_2_;
        IR::Opnd::SetValueType(this_00,(ValueType)strOpnd._6_2_);
        if (instr->m_opcode == SetConcatStrMultiItemBE) {
          bVar2 = Sym::IsPropertySym(sym);
          if (bVar2) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar5 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                               ,0x3aa1,"(!opndSym->IsPropertySym())","!opndSym->IsPropertySym()");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar5 = 0;
          }
          bVar2 = ValueType::IsString((ValueType *)((long)&strOpnd + 6));
          if (bVar2) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar5 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                               ,0x3aa2,"(!opndValueTypeInLandingPad.IsString())",
                               "!opndValueTypeInLandingPad.IsString()");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar5 = 0;
          }
          pOVar8 = IR::Instr::GetDst(instr);
          if (pOVar8 == (Opnd *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar5 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                               ,0x3aa3,"(instr->GetDst())","instr->GetDst()");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar5 = 0;
          }
          this_01 = IR::RegOpnd::New(TyVar,instr->m_func);
          IR::Opnd::SetValueType(&this_01->super_Opnd,ValueType::String);
          IR::Opnd::SetValueTypeFixed(&this_01->super_Opnd);
          pOVar8 = IR::Opnd::Use(this_00,instr->m_func);
          pIVar9 = IR::Instr::New(Conv_PrimStr,&this_01->super_Opnd,pOVar8,instr->m_func);
          IR::Instr::ReplaceSrc(instr,this_00,&this_01->super_Opnd);
          pVVar11 = pVStack_50;
          *srcOpndPtr = &this_01->super_Opnd;
          bVar2 = BVSparse<Memory::JitArenaAllocator>::IsEmpty((block->globOptData).liveFields);
          bVar2 = IsImplicitCallBailOutCurrentlyNeeded
                            (this,pIVar9,pVVar11,(Value *)0x0,block,bVar2,true,true,false);
          if (!bVar2) {
            if (loop->bailOutInfo->bailOutInstr != (Instr *)0x0) {
              IR::Instr::InsertBefore(loop->bailOutInfo->bailOutInstr,pIVar9);
              return;
            }
            BasicBlock::InsertAfter(block,pIVar9);
            return;
          }
          EnsureBailTarget(this,loop);
          IR::Instr::InsertBefore(loop->bailOutInfo->bailOutInstr,pIVar9);
          pIVar9 = IR::Instr::ConvertToBailOutInstr
                             (pIVar9,pIVar9,BailOutOnImplicitCallsPreOp,
                              loop->bailOutInfo->bailOutOffset);
          IR::Instr::ReplaceBailOutInfo(pIVar9,loop->bailOutInfo);
          return;
        }
      }
      bVar2 = Sym::IsPropertySym(sym);
      if (bVar2) {
        pPVar10 = Sym::AsPropertySym(sym);
        pVVar11 = GlobOptBlockData::FindValue(&block->globOptData,&pPVar10->m_stackSym->super_Sym);
        pVVar6 = ::Value::GetValueInfo(pVVar11);
        this_02 = IR::Opnd::AsSymOpnd(this_00);
        paVar12 = &ValueInfo::Type(pVVar6)->field_0;
        IR::SymOpnd::SetPropertyOwnerValueType
                  (this_02,(ValueType)*(anon_union_2_4_ea848c7b_for_ValueType_13 *)&paVar12->field_0
                  );
      }
    }
  }
  return;
}

Assistant:

void
GlobOpt::OptHoistUpdateValueType(
    Loop* loop,
    IR::Instr* instr,
    IR::Opnd** srcOpndPtr /* All code paths that change src, should update srcOpndPtr*/,
    Value* opndVal)
{
    if (opndVal == nullptr || instr->m_opcode == Js::OpCode::FromVar || srcOpndPtr == nullptr || *srcOpndPtr == nullptr)
    {
        return;
    }

    IR::Opnd* srcOpnd = *srcOpndPtr;

    Sym* opndSym = srcOpnd->GetSym();;

    if (opndSym)
    {
        BasicBlock* landingPad = loop->landingPad;
        Value* opndValueInLandingPad = landingPad->globOptData.FindValue(opndSym);
        Assert(opndVal->GetValueNumber() == opndValueInLandingPad->GetValueNumber());

        ValueType opndValueTypeInLandingPad = opndValueInLandingPad->GetValueInfo()->Type();

        if (srcOpnd->GetValueType() != opndValueTypeInLandingPad)
        {
            srcOpnd->SetValueType(opndValueTypeInLandingPad);

            if (instr->m_opcode == Js::OpCode::SetConcatStrMultiItemBE)
            {
                Assert(!opndSym->IsPropertySym());
                Assert(!opndValueTypeInLandingPad.IsString());
                Assert(instr->GetDst());

                IR::RegOpnd* strOpnd = IR::RegOpnd::New(TyVar, instr->m_func);
                strOpnd->SetValueType(ValueType::String);
                strOpnd->SetValueTypeFixed();
                IR::Instr* convPrimStrInstr =
                    IR::Instr::New(Js::OpCode::Conv_PrimStr, strOpnd, srcOpnd->Use(instr->m_func), instr->m_func);
                instr->ReplaceSrc(srcOpnd, strOpnd);

                // Replace above will free srcOpnd, so reassign it
                *srcOpndPtr = srcOpnd = reinterpret_cast<IR::Opnd *>(strOpnd);

                // We add ConvPrim_Str in the landingpad, and since this instruction doesn't go through the checks in OptInstr, the bailout is never added
                // As we expand hoisting of instructions to new opcode, we need a better framework to handle such cases
                if (IsImplicitCallBailOutCurrentlyNeeded(convPrimStrInstr, opndValueInLandingPad, nullptr, landingPad, landingPad->globOptData.liveFields->IsEmpty(), true, true))
                {
                    EnsureBailTarget(loop);
                    loop->bailOutInfo->bailOutInstr->InsertBefore(convPrimStrInstr);
                    convPrimStrInstr = convPrimStrInstr->ConvertToBailOutInstr(convPrimStrInstr, IR::BailOutOnImplicitCallsPreOp, loop->bailOutInfo->bailOutOffset);
                    convPrimStrInstr->ReplaceBailOutInfo(loop->bailOutInfo);
                }
                else
                {
                    if (loop->bailOutInfo->bailOutInstr)
                    {
                        loop->bailOutInfo->bailOutInstr->InsertBefore(convPrimStrInstr);
                    }
                    else
                    {
                        landingPad->InsertAfter(convPrimStrInstr);
                    }
                }

                // If we came here opndSym can't be PropertySym
                return;
            }
        }


        if (opndSym->IsPropertySym())
        {
            // Also fix valueInfo on objPtr
            StackSym* opndObjPtrSym = opndSym->AsPropertySym()->m_stackSym;
            Value* opndObjPtrSymValInLandingPad = landingPad->globOptData.FindValue(opndObjPtrSym);
            ValueInfo* opndObjPtrSymValueInfoInLandingPad = opndObjPtrSymValInLandingPad->GetValueInfo();

            srcOpnd->AsSymOpnd()->SetPropertyOwnerValueType(opndObjPtrSymValueInfoInLandingPad->Type());
        }
    }
}